

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void lodepng_info_init(LodePNGInfo *info)

{
  (info->color).key_defined = 0;
  (info->color).key_r = 0;
  (info->color).key_g = 0;
  (info->color).key_b = 0;
  (info->color).colortype = LCT_RGBA;
  (info->color).bitdepth = 8;
  (info->color).palette = (uchar *)0x0;
  (info->color).palettesize = 0;
  info->interlace_method = 0;
  info->compression_method = 0;
  info->filter_method = 0;
  info->phys_defined = 0;
  info->gama_defined = 0;
  info->chrm_defined = 0;
  info->srgb_defined = 0;
  info->background_defined = 0;
  info->background_r = 0;
  info->background_g = 0;
  info->background_b = 0;
  info->text_num = 0;
  info->text_keys = (char **)0x0;
  info->text_strings = (char **)0x0;
  info->itext_num = 0;
  info->itext_keys = (char **)0x0;
  info->itext_langtags = (char **)0x0;
  info->itext_transkeys = (char **)0x0;
  info->itext_strings = (char **)0x0;
  info->exif_defined = 0;
  info->exif = (uchar *)0x0;
  info->exif_size = 0;
  info->time_defined = 0;
  *(undefined8 *)&info->iccp_defined = 0;
  *(undefined8 *)((long)&info->iccp_name + 4) = 0;
  *(undefined4 *)((long)&info->iccp_profile + 4) = 0;
  info->sbit_r = 0;
  info->sbit_g = 0;
  info->sbit_b = 0;
  info->sbit_a = 0;
  info->clli_defined = 0;
  info->clli_max_cll = 0;
  info->clli_max_fall = 0;
  info->sbit_defined = 0;
  info->mdcv_white_x = 0;
  info->mdcv_white_y = 0;
  info->mdcv_max_luminance = 0;
  info->mdcv_min_luminance = 0;
  info->mdcv_green_x = 0;
  info->mdcv_green_y = 0;
  info->mdcv_blue_x = 0;
  info->mdcv_blue_y = 0;
  info->cicp_video_full_range_flag = 0;
  info->mdcv_defined = 0;
  info->mdcv_red_x = 0;
  info->mdcv_red_y = 0;
  info->cicp_defined = 0;
  info->cicp_color_primaries = 0;
  info->cicp_transfer_function = 0;
  info->cicp_matrix_coefficients = 0;
  info->unknown_chunks_size[1] = 0;
  info->unknown_chunks_size[2] = 0;
  info->unknown_chunks_data[2] = (uchar *)0x0;
  info->unknown_chunks_size[0] = 0;
  info->unknown_chunks_data[0] = (uchar *)0x0;
  info->unknown_chunks_data[1] = (uchar *)0x0;
  return;
}

Assistant:

void lodepng_color_mode_init(LodePNGColorMode* info) {
  info->key_defined = 0;
  info->key_r = info->key_g = info->key_b = 0;
  info->colortype = LCT_RGBA;
  info->bitdepth = 8;
  info->palette = 0;
  info->palettesize = 0;
}